

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O2

expected<void,_int> * __thiscall
nonstd::expected_lite::expected<void,_int>::operator=
          (expected<void,_int> *this,expected<void,_int> *other)

{
  anon_union_4_2_26c77401_for_storage_t_impl<void,_int>_2 local_10;
  char local_c;
  
  local_c = (other->contained).super_storage_t_impl<void,_int>.m_has_value;
  if ((bool)local_c == false) {
    local_10 = (other->contained).super_storage_t_impl<void,_int>.field_0;
  }
  swap<int>((expected<void,_int> *)&local_10,this);
  return this;
}

Assistant:

expected & operator=( expected && other ) noexcept
    (
        std::is_nothrow_move_assignable<E>::value &&
        std::is_nothrow_move_constructible<E>::value )
    {
        expected( std::move( other ) ).swap( *this );
        return *this;
    }